

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O3

bool AI::areAdjacent(Task *a,Task *b)

{
  SatisfiablePredicateIdentifier SVar1;
  undefined4 uVar2;
  pointer pRVar3;
  pointer pRVar4;
  pointer pRVar5;
  pointer pRVar6;
  pointer pRVar7;
  pointer pRVar8;
  undefined4 op;
  pointer pSVar9;
  pointer pSVar10;
  pointer pSVar11;
  pointer pCVar12;
  RequiredFlag *flag;
  pointer pRVar13;
  pointer pRVar14;
  pointer pSVar15;
  __normal_iterator<ConsumableFact_*,_std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>_>
  _Var16;
  long lVar17;
  ulong uVar18;
  ConsumableFact *pCVar19;
  ulong uVar20;
  pointer pRVar21;
  pointer pSVar22;
  pointer pRVar23;
  pointer pRVar24;
  WorldStateIdentifier WVar25;
  pointer pSVar26;
  pointer pSVar27;
  pointer pCVar28;
  pointer pCVar29;
  pointer pRVar30;
  pointer pRVar31;
  long lVar32;
  long lVar33;
  bool bVar34;
  ConsumableFact vector;
  ConsumableFact value;
  ConsumableFact flag_1;
  ConsumableFact local_3c;
  ConsumableFact local_38;
  ConsumableFact local_34;
  
  pRVar13 = (a->preconditions).requiredFlags.
            super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
            super__Vector_impl_data._M_start;
  pRVar3 = (a->preconditions).requiredFlags.
           super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pRVar13 != pRVar3) {
    pRVar4 = (b->postconditions).requiredFlags.
             super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
             super__Vector_impl_data._M_start;
    pRVar5 = (b->postconditions).requiredFlags.
             super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar20 = (long)pRVar5 - (long)pRVar4;
    pRVar21 = (pointer)((long)&pRVar4->id + (uVar20 & 0xffffffffffffffe0));
    do {
      WVar25 = (*pRVar13).id;
      uVar18 = uVar20;
      lVar17 = ((long)uVar20 >> 5) + 1;
      pRVar30 = pRVar4;
      pRVar31 = pRVar4 + 2;
      if (0 < (long)uVar20 >> 5) {
        do {
          if (pRVar31[-2].id == WVar25) {
            pRVar31 = pRVar31 + -2;
            goto LAB_001187a5;
          }
          if (pRVar31[-1].id == WVar25) {
            pRVar31 = pRVar31 + -1;
            goto LAB_001187a5;
          }
          if (pRVar31->id == WVar25) goto LAB_001187a5;
          if (pRVar31[1].id == WVar25) {
            pRVar31 = pRVar31 + 1;
            goto LAB_001187a5;
          }
          lVar17 = lVar17 + -1;
          uVar18 = (long)pRVar5 - (long)pRVar21;
          pRVar30 = pRVar21;
          pRVar31 = pRVar31 + 4;
        } while (1 < lVar17);
      }
      lVar17 = (long)uVar18 >> 3;
      if (lVar17 == 1) {
LAB_0011878b:
        pRVar31 = pRVar30;
        if (pRVar30->id != WVar25) {
          pRVar31 = pRVar5;
        }
LAB_001187a5:
        if ((pRVar31 != pRVar5) && (pRVar31->flag == (*pRVar13).flag)) {
          return true;
        }
      }
      else {
        if (lVar17 == 2) {
LAB_00118781:
          pRVar31 = pRVar30;
          if (pRVar30->id != WVar25) {
            pRVar30 = pRVar30 + 1;
            goto LAB_0011878b;
          }
          goto LAB_001187a5;
        }
        if (lVar17 == 3) {
          pRVar31 = pRVar30;
          if (pRVar30->id != WVar25) {
            pRVar30 = pRVar30 + 1;
            goto LAB_00118781;
          }
          goto LAB_001187a5;
        }
      }
      pRVar13 = pRVar13 + 1;
    } while (pRVar13 != pRVar3);
  }
  pRVar14 = (a->preconditions).requiredValues.
            super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
            super__Vector_impl_data._M_start;
  pRVar6 = (a->preconditions).requiredValues.
           super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pRVar14 != pRVar6) {
    pRVar7 = (b->postconditions).requiredValues.
             super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
             super__Vector_impl_data._M_start;
    pRVar8 = (b->postconditions).requiredValues.
             super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar17 = ((long)pRVar8 - (long)pRVar7 >> 2) * -0x5555555555555555 >> 2;
    do {
      uVar2 = pRVar14->id;
      op = pRVar14->op;
      pRVar23 = pRVar7;
      pRVar24 = pRVar7 + 2;
      lVar33 = (long)pRVar8 - (long)pRVar7;
      lVar32 = lVar17 + 1;
      if (0 < lVar17) {
        do {
          if (pRVar24[-2].id == uVar2) {
            pRVar24 = pRVar24 + -2;
            goto LAB_001188ad;
          }
          if (pRVar24[-1].id == uVar2) {
            pRVar24 = pRVar24 + -1;
            goto LAB_001188ad;
          }
          if (pRVar24->id == uVar2) goto LAB_001188ad;
          if (pRVar24[1].id == uVar2) {
            pRVar24 = pRVar24 + 1;
            goto LAB_001188ad;
          }
          lVar32 = lVar32 + -1;
          pRVar23 = pRVar7 + lVar17 * 4;
          pRVar24 = pRVar24 + 4;
          lVar33 = (long)pRVar8 - (long)(pRVar7 + lVar17 * 4);
        } while (1 < lVar32);
      }
      lVar33 = (lVar33 >> 2) * -0x5555555555555555;
      if (lVar33 == 1) {
LAB_00118894:
        pRVar24 = pRVar23;
        if (pRVar23->id != uVar2) {
          pRVar24 = pRVar8;
        }
LAB_001188ad:
        if (pRVar24 != pRVar8) {
          switch(pRVar24->op) {
          case LessThan:
            bVar34 = canLessThanSatisfy(pRVar24->value,op,pRVar14->value);
            return bVar34;
          case LessEqual:
            bVar34 = canLessEqualSatisfy(pRVar24->value,op,pRVar14->value);
            return bVar34;
          case EqualTo:
            bVar34 = canEqualToSatisfy(pRVar24->value,op,pRVar14->value);
            return bVar34;
          case NotEqualTo:
            bVar34 = canNotEqualToSatisfy(pRVar24->value,op,pRVar14->value);
            return bVar34;
          case GreaterThan:
            bVar34 = canGreaterThanSatisfy(pRVar24->value,op,pRVar14->value);
            return bVar34;
          case GreaterEqual:
            bVar34 = canGreaterEqualSatisfy(pRVar24->value,op,pRVar14->value);
            return bVar34;
          }
        }
      }
      else {
        if (lVar33 == 2) {
LAB_0011888b:
          pRVar24 = pRVar23;
          if (pRVar23->id != uVar2) {
            pRVar23 = pRVar23 + 1;
            goto LAB_00118894;
          }
          goto LAB_001188ad;
        }
        if (lVar33 == 3) {
          pRVar24 = pRVar23;
          if (pRVar23->id != uVar2) {
            pRVar23 = pRVar23 + 1;
            goto LAB_0011888b;
          }
          goto LAB_001188ad;
        }
      }
      pRVar14 = pRVar14 + 1;
    } while (pRVar14 != pRVar6);
  }
  pSVar15 = (a->preconditions).satisfiedPredicates.
            super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pSVar9 = (a->preconditions).satisfiedPredicates.
           super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar15 != pSVar9) {
    pSVar10 = (b->postconditions).satisfiedPredicates.
              super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar11 = (b->postconditions).satisfiedPredicates.
              super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    uVar20 = (long)pSVar11 - (long)pSVar10;
    pSVar22 = (pointer)((long)&pSVar10->identifier + (uVar20 & 0xffffffffffffffe0));
    do {
      SVar1 = pSVar15->identifier;
      pSVar26 = pSVar10;
      pSVar27 = pSVar10 + 2;
      uVar18 = uVar20;
      lVar17 = ((long)uVar20 >> 5) + 1;
      if (0 < (long)uVar20 >> 5) {
        do {
          if (pSVar27[-2].identifier == SVar1) {
            pSVar27 = pSVar27 + -2;
            goto LAB_0011899a;
          }
          if (pSVar27[-1].identifier == SVar1) {
            pSVar27 = pSVar27 + -1;
            goto LAB_0011899a;
          }
          if (pSVar27->identifier == SVar1) goto LAB_0011899a;
          if (pSVar27[1].identifier == SVar1) {
            pSVar27 = pSVar27 + 1;
            goto LAB_0011899a;
          }
          lVar17 = lVar17 + -1;
          pSVar26 = pSVar22;
          pSVar27 = pSVar27 + 4;
          uVar18 = (long)pSVar11 - (long)pSVar22;
        } while (1 < lVar17);
      }
      lVar17 = (long)uVar18 >> 3;
      if (lVar17 == 1) {
LAB_00118980:
        pSVar27 = pSVar26;
        if (pSVar26->identifier != SVar1) {
          pSVar27 = pSVar11;
        }
LAB_0011899a:
        if (pSVar27 != pSVar11) {
          return true;
        }
      }
      else {
        if (lVar17 == 2) {
LAB_00118976:
          pSVar27 = pSVar26;
          if (pSVar26->identifier != SVar1) {
            pSVar26 = pSVar26 + 1;
            goto LAB_00118980;
          }
          goto LAB_0011899a;
        }
        if (lVar17 == 3) {
          pSVar27 = pSVar26;
          if (pSVar26->identifier != SVar1) {
            pSVar26 = pSVar26 + 1;
            goto LAB_00118976;
          }
          goto LAB_0011899a;
        }
      }
      pSVar15 = pSVar15 + 1;
    } while (pSVar15 != pSVar9);
  }
  pCVar28 = (a->preconditions).consumableFlags.
            super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar12 = (a->preconditions).consumableFlags.
            super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pCVar28 != pCVar12) {
    pCVar19 = (b->postconditions).consumableFlags.
              super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
              super__Vector_impl_data._M_finish;
    do {
      local_34 = *pCVar28;
      _Var16 = std::
               __find_if<__gnu_cxx::__normal_iterator<ConsumableFact*,std::vector<ConsumableFact,std::allocator<ConsumableFact>>>,__gnu_cxx::__ops::_Iter_equals_val<ConsumableFact_const>>
                         ((b->postconditions).consumableFlags.
                          super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>.
                          _M_impl.super__Vector_impl_data._M_start,pCVar19,&local_34);
      pCVar19 = (b->postconditions).consumableFlags.
                super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (_Var16._M_current != pCVar19) {
        return true;
      }
      pCVar28 = pCVar28 + 1;
    } while (pCVar28 != pCVar12);
  }
  pCVar28 = (a->preconditions).consumableValues.
            super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar12 = (a->preconditions).consumableValues.
            super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pCVar28 != pCVar12) {
    pCVar19 = (b->postconditions).consumableValues.
              super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
              super__Vector_impl_data._M_finish;
    do {
      local_38 = *pCVar28;
      _Var16 = std::
               __find_if<__gnu_cxx::__normal_iterator<ConsumableFact*,std::vector<ConsumableFact,std::allocator<ConsumableFact>>>,__gnu_cxx::__ops::_Iter_equals_val<ConsumableFact_const>>
                         ((b->postconditions).consumableValues.
                          super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>.
                          _M_impl.super__Vector_impl_data._M_start,pCVar19,&local_38);
      pCVar19 = (b->postconditions).consumableValues.
                super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (_Var16._M_current != pCVar19) {
        return true;
      }
      pCVar28 = pCVar28 + 1;
    } while (pCVar28 != pCVar12);
  }
  pCVar28 = (a->preconditions).consumableVectors.
            super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar12 = (a->preconditions).consumableVectors.
            super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pCVar28 == pCVar12) {
    bVar34 = false;
  }
  else {
    pCVar19 = (b->postconditions).consumableVectors.
              super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
              super__Vector_impl_data._M_finish;
    do {
      pCVar29 = pCVar28 + 1;
      local_3c = *pCVar28;
      _Var16 = std::
               __find_if<__gnu_cxx::__normal_iterator<ConsumableFact*,std::vector<ConsumableFact,std::allocator<ConsumableFact>>>,__gnu_cxx::__ops::_Iter_equals_val<ConsumableFact_const>>
                         ((b->postconditions).consumableVectors.
                          super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>.
                          _M_impl.super__Vector_impl_data._M_start,pCVar19,&local_3c);
      pCVar19 = (b->postconditions).consumableVectors.
                super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
                super__Vector_impl_data._M_finish;
      bVar34 = _Var16._M_current != pCVar19;
      if (bVar34) {
        return bVar34;
      }
      pCVar28 = pCVar29;
    } while (pCVar29 != pCVar12);
  }
  return bVar34;
}

Assistant:

bool areAdjacent(Task& a, Task& b)
	{
		auto& precondition = a.preconditions;		

		for (auto& flag : precondition.requiredFlags)
		{
			const auto& matchingFlag = std::find_if(begin(b.postconditions.requiredFlags), end(b.postconditions.requiredFlags),
				[flag](auto& f) {return f.id == flag.id;});

			if (matchingFlag != end(b.postconditions.requiredFlags))
			{
				if (flag.flag == matchingFlag->flag)
				{
					return true;
				}
			}
		}

		for (auto& value : precondition.requiredValues)
		{
			const auto& matchingValue = std::find_if(begin(b.postconditions.requiredValues), end(b.postconditions.requiredValues),
				[value](auto& v){return v.id == value.id;});

			if (matchingValue != end(b.postconditions.requiredValues))
			{
				switch(matchingValue->op)
				{
					case ConditionOp::LessThan
						:
					{
						return canLessThanSatisfy(matchingValue->value, value.op, value.value);
					}
					case ConditionOp::GreaterThan
						:
					{
						return canGreaterThanSatisfy(matchingValue->value, value.op, value.value);
					}
					case ConditionOp::EqualTo
						:
					{
						return canEqualToSatisfy(matchingValue->value, value.op, value.value);
					}
					case ConditionOp::NotEqualTo
						:
					{
						return canNotEqualToSatisfy(matchingValue->value, value.op, value.value);
					}
					case ConditionOp::LessEqual
						:
					{
						return canLessEqualSatisfy(matchingValue->value, value.op, value.value);
					}
					case ConditionOp::GreaterEqual
						:
					{
						return canGreaterEqualSatisfy(matchingValue->value, value.op, value.value);
					}
				}
			}
		}

		for (auto satisfiedPredicate : precondition.satisfiedPredicates)
		{
			const auto& it = std::find_if(begin(b.postconditions.satisfiedPredicates), end(b.postconditions.satisfiedPredicates),
				[satisfiedPredicate](auto& sp){return sp.identifier == satisfiedPredicate.identifier;});	
			
			if (it != end(b.postconditions.satisfiedPredicates))
			{
				return true;
			}
		}

		for (auto flag : precondition.consumableFlags)
		{
			if (std::find(begin(b.postconditions.consumableFlags), end(b.postconditions.consumableFlags), flag)
				!= end(b.postconditions.consumableFlags))
			{
				return true;
			}
		}

		for (auto value : precondition.consumableValues)
		{
			if (std::find(begin(b.postconditions.consumableValues), end(b.postconditions.consumableValues), value)
				!= end(b.postconditions.consumableValues))
			{
				return true;
			}
		}

		for (auto vector : precondition.consumableVectors)
		{
			if (std::find(begin(b.postconditions.consumableVectors), end(b.postconditions.consumableVectors), vector)
				!= end(b.postconditions.consumableVectors))
			{
				return true;
			}
		}

		return false;
	}